

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

wchar_t rd_stores(void)

{
  char *pcVar1;
  owner *poVar2;
  object *poVar3;
  store_conflict *s;
  ulong uVar4;
  uint8_t num;
  uint8_t own;
  uint16_t tmp16u;
  object *obj;
  
  rd_u16b(&tmp16u);
  if (tmp16u != z_info->store_max) {
    pcVar1 = format("The number of stores in the savefile (%u) is different than expected (%u).");
    note(pcVar1);
  }
  uVar4 = 0;
  do {
    if (tmp16u <= uVar4) {
      return L'\0';
    }
    s = stores + uVar4;
    if (z_info->store_max <= uVar4) {
      s = (store_conflict *)0x0;
    }
    rd_byte(&own);
    rd_byte(&num);
    if (s != (store_conflict *)0x0) {
      poVar2 = store_ownerbyidx(s,(uint)own);
      s->owner = poVar2;
    }
    for (; num != '\0'; num = num + 0xff) {
      poVar3 = rd_item();
      if (poVar3 == (object *)0x0) {
        pcVar1 = "Error reading known item";
LAB_0015edde:
        note(pcVar1);
        return L'\xffffffff';
      }
      obj = rd_item();
      if (obj == (object *)0x0) {
        pcVar1 = "Error reading item";
        goto LAB_0015edde;
      }
      obj->known = poVar3;
      if (((s == (store_conflict *)0x0) || (z_info->store_inven_max <= (ushort)s->stock_num)) ||
         (obj->kind == (object_kind *)0x0)) {
        object_delete((chunk *)0x0,(chunk *)0x0,&obj->known);
        object_delete((chunk *)0x0,(chunk *)0x0,&obj);
      }
      else if (s->feat == 0xe) {
        home_carry(obj);
      }
      else {
        store_carry(s,obj);
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int rd_stores(void) { return rd_stores_aux(rd_item); }